

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::display(QLCDNumber *this,double num)

{
  QLCDNumberPrivate *pQVar1;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int unaff_retaddr;
  int unaff_retaddr_00;
  QLCDNumberPrivate *d;
  QString s;
  bool of;
  QString *s_00;
  
  s_00 = *(QString **)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QLCDNumber *)0x5b9e6f);
  pQVar1->val = in_XMM0_Qa;
  double2string((double)d,unaff_retaddr_00,unaff_retaddr,(bool *)s_00);
  QLCDNumberPrivate::internalSetString
            ((QLCDNumberPrivate *)CONCAT44(unaff_retaddr_00,unaff_retaddr),s_00);
  QString::~QString((QString *)0x5b9f12);
  if (*(QString **)(in_FS_OFFSET + 0x28) != s_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::display(double num)
{
    Q_D(QLCDNumber);
    d->val = num;
    bool of;
    QString s = double2string(d->val, d->base, d->ndigits, &of);
    if (of)
        emit overflow();
    else
        d->internalSetString(s);
}